

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void __thiscall
wallet::wallet_tests::coin_mark_dirty_immature_credit::coin_mark_dirty_immature_credit
          (coin_mark_dirty_immature_credit *this)

{
  long lVar1;
  TestOpts opts;
  long in_FS_OFFSET;
  uint in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  opts.coins_db_in_memory = true;
  opts.block_tree_db_in_memory = true;
  opts.setup_net = true;
  opts.setup_validation_interface = true;
  opts._28_4_ = in_stack_ffffffffffffffe4 & 0xffffff00;
  TestChain100Setup::TestChain100Setup(&this->super_TestChain100Setup,REGTEST,opts);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(coin_mark_dirty_immature_credit, TestChain100Setup)
{
    CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());

    LOCK(wallet.cs_wallet);
    LOCK(Assert(m_node.chainman)->GetMutex());
    CWalletTx wtx{m_coinbase_txns.back(), TxStateConfirmed{m_node.chainman->ActiveChain().Tip()->GetBlockHash(), m_node.chainman->ActiveChain().Height(), /*index=*/0}};
    wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
    wallet.SetupDescriptorScriptPubKeyMans();

    wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());

    // Call GetImmatureCredit() once before adding the key to the wallet to
    // cache the current immature credit amount, which is 0.
    BOOST_CHECK_EQUAL(CachedTxGetImmatureCredit(wallet, wtx, ISMINE_SPENDABLE), 0);

    // Invalidate the cached value, add the key, and make sure a new immature
    // credit amount is calculated.
    wtx.MarkDirty();
    AddKey(wallet, coinbaseKey);
    BOOST_CHECK_EQUAL(CachedTxGetImmatureCredit(wallet, wtx, ISMINE_SPENDABLE), 50*COIN);
}